

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

bool __thiscall cmCTestGIT::UpdateImpl(cmCTestGIT *this)

{
  cmCTest *this_00;
  string_view val;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  char *local_208;
  char *git_submodule [5];
  char *local_1d8;
  char *git_submodule_sync [5];
  char *local_1a8;
  char *git_submodule_init [4];
  allocator<char> local_169;
  string local_168;
  undefined1 local_148 [8];
  string init_submodules;
  undefined1 local_120 [7];
  bool ret;
  OutputLogger submodule_err;
  OutputLogger submodule_out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  char *local_50;
  char *sync_recursive;
  char *recursive;
  char *git;
  string top_dir;
  cmCTestGIT *this_local;
  
  top_dir.field_2._8_8_ = this;
  bVar1 = UpdateInternal(this);
  if (!bVar1) {
    return false;
  }
  FindTopDir_abi_cxx11_((string *)&git,this);
  recursive = (char *)std::__cxx11::string::c_str();
  sync_recursive = "--recursive";
  local_50 = "--recursive";
  uVar2 = GetGitVersion(this);
  uVar3 = cmCTestGITVersion(1,6,5,0);
  if (uVar2 < uVar3) {
    sync_recursive = (char *)0x0;
    std::operator+(&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&git,
                   "/.gitmodules");
    bVar1 = cmsys::SystemTools::FileExists(&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    if (bVar1) {
      std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                      "Git < 1.6.5 cannot update submodules recursively\n");
    }
  }
  uVar2 = GetGitVersion(this);
  uVar3 = cmCTestGITVersion(1,8,1,0);
  if (uVar2 < uVar3) {
    local_50 = (char *)0x0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &submodule_out.super_LineParser.Separator,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&git,
                   "/.gitmodules");
    bVar1 = cmsys::SystemTools::FileExists((string *)&submodule_out.super_LineParser.Separator);
    std::__cxx11::string::~string((string *)&submodule_out.super_LineParser.Separator);
    if (bVar1) {
      std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                      "Git < 1.8.1 cannot synchronize submodules recursively\n");
    }
  }
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)&submodule_err.super_LineParser.Separator,
             (this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"submodule-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_120,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "submodule-err> ");
  this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"GITInitSubmodules",&local_169);
  cmCTest::GetCTestConfiguration((string *)local_148,this_00,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  val = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_148);
  bVar1 = cmIsOn(val);
  if (bVar1) {
    local_1a8 = recursive;
    git_submodule_init[0] = "submodule";
    git_submodule_init[1] = "init";
    git_submodule_init[2] = (char *)0x0;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    init_submodules.field_2._M_local_buf[0xf] =
         cmCTestVC::RunChild((cmCTestVC *)this,&local_1a8,
                             (OutputParser *)&submodule_err.super_LineParser.Separator,
                             (OutputParser *)local_120,pcVar4,Auto);
    if (!(bool)init_submodules.field_2._M_local_buf[0xf]) {
      this_local._7_1_ = false;
      goto LAB_0026cb91;
    }
  }
  local_1d8 = recursive;
  git_submodule_sync[0] = "submodule";
  git_submodule_sync[1] = "sync";
  git_submodule_sync[2] = local_50;
  git_submodule_sync[3] = (char *)0x0;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  init_submodules.field_2._M_local_buf[0xf] =
       cmCTestVC::RunChild((cmCTestVC *)this,&local_1d8,
                           (OutputParser *)&submodule_err.super_LineParser.Separator,
                           (OutputParser *)local_120,pcVar4,Auto);
  if ((bool)init_submodules.field_2._M_local_buf[0xf]) {
    local_208 = recursive;
    git_submodule[0] = "submodule";
    git_submodule[1] = "update";
    git_submodule[2] = sync_recursive;
    git_submodule[3] = (char *)0x0;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    this_local._7_1_ =
         cmCTestVC::RunChild((cmCTestVC *)this,&local_208,
                             (OutputParser *)&submodule_err.super_LineParser.Separator,
                             (OutputParser *)local_120,pcVar4,Auto);
  }
  else {
    this_local._7_1_ = false;
  }
LAB_0026cb91:
  git_submodule_sync[4]._4_4_ = 1;
  std::__cxx11::string::~string((string *)local_148);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_120);
  cmProcessTools::OutputLogger::~OutputLogger
            ((OutputLogger *)&submodule_err.super_LineParser.Separator);
  std::__cxx11::string::~string((string *)&git);
  return this_local._7_1_;
}

Assistant:

bool cmCTestGIT::UpdateImpl()
{
  if (!this->UpdateInternal()) {
    return false;
  }

  std::string top_dir = this->FindTopDir();
  const char* git = this->CommandLineTool.c_str();
  const char* recursive = "--recursive";
  const char* sync_recursive = "--recursive";

  // Git < 1.6.5 did not support submodule --recursive
  if (this->GetGitVersion() < cmCTestGITVersion(1, 6, 5, 0)) {
    recursive = nullptr;
    // No need to require >= 1.6.5 if there are no submodules.
    if (cmSystemTools::FileExists(top_dir + "/.gitmodules")) {
      this->Log << "Git < 1.6.5 cannot update submodules recursively\n";
    }
  }

  // Git < 1.8.1 did not support sync --recursive
  if (this->GetGitVersion() < cmCTestGITVersion(1, 8, 1, 0)) {
    sync_recursive = nullptr;
    // No need to require >= 1.8.1 if there are no submodules.
    if (cmSystemTools::FileExists(top_dir + "/.gitmodules")) {
      this->Log << "Git < 1.8.1 cannot synchronize submodules recursively\n";
    }
  }

  OutputLogger submodule_out(this->Log, "submodule-out> ");
  OutputLogger submodule_err(this->Log, "submodule-err> ");

  bool ret;

  std::string init_submodules =
    this->CTest->GetCTestConfiguration("GITInitSubmodules");
  if (cmIsOn(init_submodules)) {
    char const* git_submodule_init[] = { git, "submodule", "init", nullptr };
    ret = this->RunChild(git_submodule_init, &submodule_out, &submodule_err,
                         top_dir.c_str());

    if (!ret) {
      return false;
    }
  }

  char const* git_submodule_sync[] = { git, "submodule", "sync",
                                       sync_recursive, nullptr };
  ret = this->RunChild(git_submodule_sync, &submodule_out, &submodule_err,
                       top_dir.c_str());

  if (!ret) {
    return false;
  }

  char const* git_submodule[] = { git, "submodule", "update", recursive,
                                  nullptr };
  return this->RunChild(git_submodule, &submodule_out, &submodule_err,
                        top_dir.c_str());
}